

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall ctemplate::TemplateCache::Freeze(TemplateCache *this)

{
  WriterMutexLock local_28;
  WriterMutexLock ml_1;
  ReaderMutexLock local_18;
  ReaderMutexLock ml;
  TemplateCache *this_local;
  
  ml.mu_ = (Mutex *)this;
  ReaderMutexLock::ReaderMutexLock(&local_18,this->mutex_);
  ml_1.mu_._5_3_ = 0;
  ml_1.mu_._4_1_ = (this->is_frozen_ & 1U) != 0;
  ReaderMutexLock::~ReaderMutexLock(&local_18);
  if (ml_1.mu_._4_4_ == 0) {
    ReloadAllIfChanged(this,IMMEDIATE_RELOAD);
    WriterMutexLock::WriterMutexLock(&local_28,this->mutex_);
    this->is_frozen_ = true;
    WriterMutexLock::~WriterMutexLock(&local_28);
  }
  return;
}

Assistant:

void TemplateCache::Freeze() {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // if already frozen, then this is a no-op.
      return;
    }
  }
  // A final reload before freezing the cache.
  ReloadAllIfChanged(IMMEDIATE_RELOAD);
  {
    WriterMutexLock ml(mutex_);
    is_frozen_ = true;
  }
}